

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumbAddSPReg(MCInst *Inst,uint16_t Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint uVar4;
  DecodeStatus DVar5;
  uint Rm;
  uint Rdm;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint16_t Insn_local;
  MCInst *Inst_local;
  
  Rm = 3;
  _Rdm = Decoder;
  Decoder_local = (void *)Address;
  Address_local._6_2_ = Insn;
  pMStack_18 = Inst;
  uVar4 = MCInst_getOpcode(Inst);
  if (uVar4 == 0xa81) {
    uVar2 = fieldFromInstruction_2(Address_local._6_2_,0,3);
    uVar3 = fieldFromInstruction_2(Address_local._6_2_,7,1);
    uVar4 = (uint)uVar3 << 3 | (uint)uVar2;
    DVar5 = DecodeGPRRegisterClass(pMStack_18,uVar4,(uint64_t)Decoder_local,_Rdm);
    _Var1 = Check(&Rm,DVar5);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
    MCOperand_CreateReg0(pMStack_18,0xc);
    DVar5 = DecodeGPRRegisterClass(pMStack_18,uVar4,(uint64_t)Decoder_local,_Rdm);
    _Var1 = Check(&Rm,DVar5);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else {
    uVar4 = MCInst_getOpcode(pMStack_18);
    if (uVar4 == 0xa85) {
      uVar2 = fieldFromInstruction_2(Address_local._6_2_,3,4);
      MCOperand_CreateReg0(pMStack_18,0xc);
      MCOperand_CreateReg0(pMStack_18,0xc);
      DVar5 = DecodeGPRRegisterClass(pMStack_18,(uint)uVar2,(uint64_t)Decoder_local,_Rdm);
      _Var1 = Check(&Rm,DVar5);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
  }
  return Rm;
}

Assistant:

static DecodeStatus DecodeThumbAddSPReg(MCInst *Inst, uint16_t Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	if (MCInst_getOpcode(Inst) == ARM_tADDrSP) {
		unsigned Rdm = fieldFromInstruction_2(Insn, 0, 3);
		Rdm |= fieldFromInstruction_2(Insn, 7, 1) << 3;

		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rdm, Address, Decoder)))
			return MCDisassembler_Fail;
		MCOperand_CreateReg0(Inst, ARM_SP);
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rdm, Address, Decoder)))
			return MCDisassembler_Fail;
	} else if (MCInst_getOpcode(Inst) == ARM_tADDspr) {
		unsigned Rm = fieldFromInstruction_2(Insn, 3, 4);

		MCOperand_CreateReg0(Inst, ARM_SP);
		MCOperand_CreateReg0(Inst, ARM_SP);
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}